

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eh_frame.cc
# Opt level: O0

uint64_t bloaty::ReadEncodedPointer
                   (uint8_t encoding,bool is_64bit,string_view *data,char *data_base,RangeSink *sink
                   )

{
  unsigned_short uVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  const_pointer ptr_00;
  uint64_t uVar6;
  long in_RCX;
  basic_string_view<char,_std::char_traits<char>_> *in_RDX;
  byte in_SIL;
  byte in_DIL;
  string_view location;
  uint8_t application;
  uint8_t format;
  char *ptr;
  uint64_t value;
  string_view *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffed8;
  string_view in_stack_fffffffffffffee0;
  undefined1 local_d0 [35];
  byte local_ad;
  uint64_t in_stack_ffffffffffffff68;
  RangeSink *in_stack_ffffffffffffff70;
  RangeSink *local_8;
  
  ptr_00 = std::basic_string_view<char,_std::char_traits<char>_>::data(in_RDX);
  uVar5 = (uint)(in_DIL & 0xf);
  if (uVar5 == 0) {
    if ((in_SIL & 1) == 0) {
      uVar3 = ReadFixed<unsigned_int,4ul>(in_stack_fffffffffffffeb0);
      local_8 = (RangeSink *)(ulong)uVar3;
    }
    else {
      local_8 = (RangeSink *)ReadFixed<unsigned_long,8ul>(in_stack_fffffffffffffeb0);
    }
  }
  else if (uVar5 == 1) {
    local_8 = (RangeSink *)
              dwarf::ReadLEB128<unsigned_long>
                        ((string_view *)
                         CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  }
  else if (uVar5 == 2) {
    uVar1 = ReadFixed<unsigned_short,2ul>(in_stack_fffffffffffffeb0);
    local_8 = (RangeSink *)(ulong)uVar1;
  }
  else if (uVar5 == 3) {
    uVar3 = ReadFixed<unsigned_int,4ul>(in_stack_fffffffffffffeb0);
    local_8 = (RangeSink *)(ulong)uVar3;
  }
  else if (uVar5 == 4) {
    local_8 = (RangeSink *)ReadFixed<unsigned_long,8ul>(in_stack_fffffffffffffeb0);
  }
  else if (uVar5 == 9) {
    local_8 = (RangeSink *)
              dwarf::ReadLEB128<long>
                        ((string_view *)
                         CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  }
  else if (uVar5 == 10) {
    sVar2 = ReadFixed<short,2ul>(in_stack_fffffffffffffeb0);
    local_8 = (RangeSink *)(long)sVar2;
  }
  else if (uVar5 == 0xb) {
    iVar4 = ReadFixed<int,4ul>(in_stack_fffffffffffffeb0);
    local_8 = (RangeSink *)(long)iVar4;
  }
  else {
    if (uVar5 != 0xc) {
      if (uVar5 == 0xff) {
        return 0;
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffeb8);
      iVar4 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
      absl::substitute_internal::Arg::Arg
                ((Arg *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),iVar4);
      absl::Substitute_abi_cxx11_
                (in_stack_fffffffffffffee0,(Arg *)CONCAT44(uVar5,in_stack_fffffffffffffed8));
      std::__cxx11::string::c_str();
      Throw((char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),iVar4);
    }
    local_8 = (RangeSink *)ReadFixed<long,8ul>(in_stack_fffffffffffffeb0);
  }
  local_ad = in_DIL & 0x70;
  uVar3 = (uint)local_ad;
  if (uVar3 != 0) {
    if (uVar3 == 0x10) {
      uVar6 = RangeSink::TranslateFileToVM(local_8,ptr_00);
      local_8 = (RangeSink *)((long)(&(local_8->options_)._has_bits_ + -6) + uVar6);
    }
    else {
      if (uVar3 == 0x20) {
LAB_00212f20:
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   (ulong)(CONCAT14(in_DIL,in_stack_fffffffffffffec0) & 0x70ffffffff),
                   in_stack_fffffffffffffeb8);
        absl::substitute_internal::Arg::Arg
                  ((Arg *)CONCAT44(uVar3,in_stack_fffffffffffffec0),
                   (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
        iVar4 = (int)((ulong)local_d0 >> 0x20);
        absl::Substitute_abi_cxx11_
                  (in_stack_fffffffffffffee0,(Arg *)CONCAT44(uVar5,in_stack_fffffffffffffed8));
        std::__cxx11::string::c_str();
        Throw((char *)CONCAT44(uVar3,in_stack_fffffffffffffec0),iVar4);
      }
      if (uVar3 == 0x30) {
        if (in_RCX == 0) {
          Throw((char *)(ulong)(CONCAT14(in_DIL,in_stack_fffffffffffffec0) & 0x70ffffffff),
                (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
        }
        uVar6 = RangeSink::TranslateFileToVM(local_8,ptr_00);
        local_8 = (RangeSink *)((long)(&(local_8->options_)._has_bits_ + -6) + uVar6);
      }
      else if ((uVar3 == 0x40) || (uVar3 == 0x50)) goto LAB_00212f20;
    }
  }
  if ((in_DIL & 0x80) != 0) {
    RangeSink::TranslateVMToFile(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if ((in_SIL & 1) == 0) {
      uVar5 = ReadFixed<unsigned_int,4ul>(in_stack_fffffffffffffeb0);
      local_8 = (RangeSink *)(ulong)uVar5;
    }
    else {
      local_8 = (RangeSink *)ReadFixed<unsigned_long,8ul>(in_stack_fffffffffffffeb0);
    }
  }
  return (uint64_t)local_8;
}

Assistant:

uint64_t ReadEncodedPointer(uint8_t encoding, bool is_64bit, string_view* data,
                            const char* data_base, RangeSink* sink) {
  uint64_t value;
  const char* ptr = data->data();
  uint8_t format = encoding & DW_EH_PE_FORMAT_MASK;

  switch (format) {
    case DW_EH_PE_omit:
      return 0;
    case DW_EH_PE_absptr:
      if (is_64bit) {
        value = ReadFixed<uint64_t>(data);
      } else {
        value = ReadFixed<uint32_t>(data);
      }
      break;
    case DW_EH_PE_uleb128:
      value = dwarf::ReadLEB128<uint64_t>(data);
      break;
    case DW_EH_PE_udata2:
      value = ReadFixed<uint16_t>(data);
      break;
    case DW_EH_PE_udata4:
      value = ReadFixed<uint32_t>(data);
      break;
    case DW_EH_PE_udata8:
      value = ReadFixed<uint64_t>(data);
      break;
    case DW_EH_PE_sleb128:
      value = dwarf::ReadLEB128<int64_t>(data);
      break;
    case DW_EH_PE_sdata2:
      value = ReadFixed<int16_t>(data);
      break;
    case DW_EH_PE_sdata4:
      value = ReadFixed<int32_t>(data);
      break;
    case DW_EH_PE_sdata8:
      value = ReadFixed<int64_t>(data);
      break;
    default:
      THROWF("Unexpected eh_frame format value: $0", format);
  }

  uint8_t application = encoding & DW_EH_PE_APPLICATION_MASK;

  switch (application) {
    case 0:
      break;
    case DW_EH_PE_pcrel:
      value += sink->TranslateFileToVM(ptr);
      break;
    case DW_EH_PE_datarel:
      if (data_base == nullptr) {
        THROW("datarel requested but no data_base provided");
      }
      value += sink->TranslateFileToVM(data_base);
      break;
    case DW_EH_PE_textrel:
    case DW_EH_PE_funcrel:
    case DW_EH_PE_aligned:
      THROWF("Unimplemented eh_frame application value: $0", application);
  }

  if (encoding & DW_EH_PE_indirect) {
    string_view location = sink->TranslateVMToFile(value);
    if (is_64bit) {
      value = ReadFixed<uint64_t>(&location);
    } else {
      value = ReadFixed<uint32_t>(&location);
    }
  }

  return value;
}